

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerSafe::Resign(Error *__return_storage_ptr__,CommissionerSafe *this)

{
  promise<ot::commissioner::Error> pro;
  __basic_future<ot::commissioner::Error> local_60;
  promise<ot::commissioner::Error> local_50;
  promise<ot::commissioner::Error> *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  
  std::promise<ot::commissioner::Error>::promise(&local_50);
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:219:32)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:219:32)>
             ::_M_manager;
  local_38 = &local_50;
  (*(this->super_Commissioner)._vptr_Commissioner[0xf])(this);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  std::__basic_future<ot::commissioner::Error>::__basic_future(&local_60,&local_50._M_future);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_60);
  if (local_60._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<ot::commissioner::Error>::~promise(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::Resign()
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    Resign(wait);
    return pro.get_future().get();
}